

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmNtk.c
# Opt level: O0

int Sfm_NodeReadUsed(Sfm_Ntk_t *p,int i)

{
  int iVar1;
  undefined1 local_15;
  int i_local;
  Sfm_Ntk_t *p_local;
  
  iVar1 = Sfm_ObjFaninNum(p,i);
  local_15 = true;
  if (iVar1 < 1) {
    iVar1 = Sfm_ObjFanoutNum(p,i);
    local_15 = 0 < iVar1;
  }
  return (int)local_15;
}

Assistant:

int Sfm_NodeReadUsed( Sfm_Ntk_t * p, int i )
{
    return (Sfm_ObjFaninNum(p, i) > 0) || (Sfm_ObjFanoutNum(p, i) > 0);
}